

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_add_text(LodePNGInfo *info,char *key,char *str)

{
  size_t sVar1;
  uint uVar2;
  char **ppcVar3;
  char **__ptr;
  char *pcVar4;
  
  ppcVar3 = (char **)realloc(info->text_keys,info->text_num * 8 + 8);
  __ptr = (char **)realloc(info->text_strings,info->text_num * 8 + 8);
  if (ppcVar3 == (char **)0x0 || __ptr == (char **)0x0) {
    free(ppcVar3);
    free(__ptr);
    uVar2 = 0x53;
  }
  else {
    sVar1 = info->text_num;
    info->text_num = sVar1 + 1;
    info->text_keys = ppcVar3;
    info->text_strings = __ptr;
    ppcVar3[sVar1] = (char *)0x0;
    pcVar4 = (char *)malloc(1);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ppcVar3[sVar1] = pcVar4;
    }
    string_set(ppcVar3 + sVar1,key);
    sVar1 = info->text_num;
    ppcVar3 = info->text_strings;
    ppcVar3[sVar1 - 1] = (char *)0x0;
    pcVar4 = (char *)malloc(1);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      ppcVar3[sVar1 - 1] = pcVar4;
    }
    string_set(info->text_strings + (info->text_num - 1),str);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

unsigned lodepng_add_text(LodePNGInfo* info, const char* key, const char* str)
{
	char** new_keys = (char**)(lodepng_realloc(info->text_keys, sizeof(char*) * (info->text_num + 1)));
	char** new_strings = (char**)(lodepng_realloc(info->text_strings, sizeof(char*) * (info->text_num + 1)));
	if (!new_keys || !new_strings)
	{
		lodepng_free(new_keys);
		lodepng_free(new_strings);
		return 83; /*alloc fail*/
	}

	++info->text_num;
	info->text_keys = new_keys;
	info->text_strings = new_strings;

	string_init(&info->text_keys[info->text_num - 1]);
	string_set(&info->text_keys[info->text_num - 1], key);

	string_init(&info->text_strings[info->text_num - 1]);
	string_set(&info->text_strings[info->text_num - 1], str);

	return 0;
}